

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O3

void process(lzma_check_state *check)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint uVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  uint uVar35;
  uint uVar36;
  long lVar37;
  uint uVar38;
  int iVar39;
  uint unaff_EBP;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint in_R8D;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  uint uVar46;
  uint32_t uVar47;
  uint32_t uVar48;
  uint uVar49;
  uint32_t uVar50;
  uint uVar51;
  uint uVar52;
  ulong unaff_R15;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  uint32_t data [16];
  uint local_158;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  uint local_134;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  lVar37 = 0;
  do {
    auVar53 = *(undefined1 (*) [16])((long)&check->buffer + lVar37 * 4);
    auVar54[1] = 0;
    auVar54[0] = auVar53[8];
    auVar54[2] = auVar53[9];
    auVar54[3] = 0;
    auVar54[4] = auVar53[10];
    auVar54[5] = 0;
    auVar54[6] = auVar53[0xb];
    auVar54[7] = 0;
    auVar54[8] = auVar53[0xc];
    auVar54[9] = 0;
    auVar54[10] = auVar53[0xd];
    auVar54[0xb] = 0;
    auVar54[0xc] = auVar53[0xe];
    auVar54[0xd] = 0;
    auVar54[0xe] = auVar53[0xf];
    auVar54[0xf] = 0;
    auVar54 = pshuflw(auVar54,auVar54,0x1b);
    auVar54 = pshufhw(auVar54,auVar54,0x1b);
    auVar25[0xd] = 0;
    auVar25._0_13_ = auVar53._0_13_;
    auVar25[0xe] = auVar53[7];
    auVar26[0xc] = auVar53[6];
    auVar26._0_12_ = auVar53._0_12_;
    auVar26._13_2_ = auVar25._13_2_;
    auVar27[0xb] = 0;
    auVar27._0_11_ = auVar53._0_11_;
    auVar27._12_3_ = auVar26._12_3_;
    auVar28[10] = auVar53[5];
    auVar28._0_10_ = auVar53._0_10_;
    auVar28._11_4_ = auVar27._11_4_;
    auVar29[9] = 0;
    auVar29._0_9_ = auVar53._0_9_;
    auVar29._10_5_ = auVar28._10_5_;
    auVar30[8] = auVar53[4];
    auVar30._0_8_ = auVar53._0_8_;
    auVar30._9_6_ = auVar29._9_6_;
    auVar32._7_8_ = 0;
    auVar32._0_7_ = auVar30._8_7_;
    auVar33._1_8_ = SUB158(auVar32 << 0x40,7);
    auVar33[0] = auVar53[3];
    auVar33._9_6_ = 0;
    auVar34._1_10_ = SUB1510(auVar33 << 0x30,5);
    auVar34[0] = auVar53[2];
    auVar34._11_4_ = 0;
    auVar31[2] = auVar53[1];
    auVar31._0_2_ = auVar53._0_2_;
    auVar31._3_12_ = SUB1512(auVar34 << 0x20,3);
    auVar53._0_2_ = auVar53._0_2_ & 0xff;
    auVar53._2_13_ = auVar31._2_13_;
    auVar53[0xf] = 0;
    auVar53 = pshuflw(auVar53,auVar53,0x1b);
    auVar53 = pshufhw(auVar53,auVar53,0x1b);
    sVar9 = auVar53._0_2_;
    sVar10 = auVar53._2_2_;
    sVar11 = auVar53._4_2_;
    sVar12 = auVar53._6_2_;
    sVar13 = auVar53._8_2_;
    sVar14 = auVar53._10_2_;
    sVar15 = auVar53._12_2_;
    sVar16 = auVar53._14_2_;
    sVar17 = auVar54._0_2_;
    sVar18 = auVar54._2_2_;
    sVar19 = auVar54._4_2_;
    sVar20 = auVar54._6_2_;
    sVar21 = auVar54._8_2_;
    sVar22 = auVar54._10_2_;
    sVar23 = auVar54._12_2_;
    sVar24 = auVar54._14_2_;
    lVar1 = lVar37 * 4;
    *(char *)(&local_78 + lVar37) = (0 < sVar9) * (sVar9 < 0x100) * auVar53[0] - (0xff < sVar9);
    *(char *)((long)&local_78 + lVar1 + 1) =
         (0 < sVar10) * (sVar10 < 0x100) * auVar53[2] - (0xff < sVar10);
    *(char *)((long)&local_78 + lVar1 + 2) =
         (0 < sVar11) * (sVar11 < 0x100) * auVar53[4] - (0xff < sVar11);
    *(char *)((long)&local_78 + lVar1 + 3) =
         (0 < sVar12) * (sVar12 < 0x100) * auVar53[6] - (0xff < sVar12);
    *(char *)(&local_74 + lVar37) = (0 < sVar13) * (sVar13 < 0x100) * auVar53[8] - (0xff < sVar13);
    *(char *)((long)&local_74 + lVar1 + 1) =
         (0 < sVar14) * (sVar14 < 0x100) * auVar53[10] - (0xff < sVar14);
    *(char *)((long)&local_74 + lVar1 + 2) =
         (0 < sVar15) * (sVar15 < 0x100) * auVar53[0xc] - (0xff < sVar15);
    *(char *)((long)&local_74 + lVar1 + 3) =
         (0 < sVar16) * (sVar16 < 0x100) * auVar53[0xe] - (0xff < sVar16);
    *(char *)(&local_70 + lVar37) = (0 < sVar17) * (sVar17 < 0x100) * auVar54[0] - (0xff < sVar17);
    *(char *)((long)&local_70 + lVar1 + 1) =
         (0 < sVar18) * (sVar18 < 0x100) * auVar54[2] - (0xff < sVar18);
    *(char *)((long)&local_70 + lVar1 + 2) =
         (0 < sVar19) * (sVar19 < 0x100) * auVar54[4] - (0xff < sVar19);
    *(char *)((long)&local_70 + lVar1 + 3) =
         (0 < sVar20) * (sVar20 < 0x100) * auVar54[6] - (0xff < sVar20);
    *(char *)(&local_6c + lVar37) = (0 < sVar21) * (sVar21 < 0x100) * auVar54[8] - (0xff < sVar21);
    *(char *)((long)&local_6c + lVar1 + 1) =
         (0 < sVar22) * (sVar22 < 0x100) * auVar54[10] - (0xff < sVar22);
    *(char *)((long)&local_6c + lVar1 + 2) =
         (0 < sVar23) * (sVar23 < 0x100) * auVar54[0xc] - (0xff < sVar23);
    *(char *)((long)&local_6c + lVar1 + 3) =
         (0 < sVar24) * (sVar24 < 0x100) * auVar54[0xe] - (0xff < sVar24);
    lVar37 = lVar37 + 4;
  } while (lVar37 != 0x10);
  uVar2 = (check->state).sha256.state[1];
  uVar3 = (check->state).sha256.state[2];
  uVar4 = (check->state).sha256.state[3];
  uVar5 = (check->state).sha256.state[4];
  uVar6 = (check->state).sha256.state[5];
  uVar7 = (check->state).sha256.state[6];
  uVar8 = (check->state).sha256.state[7];
  uVar45 = 0xfffffffffffffff0;
  uVar41 = (check->state).crc32;
  uVar36 = uVar2;
  uVar35 = uVar3;
  uVar38 = uVar4;
  uVar47 = uVar5;
  uVar50 = uVar6;
  uVar48 = uVar7;
  uVar44 = uVar8;
  uVar42 = uVar2;
  do {
    uVar46 = (uint)unaff_R15;
    uVar43 = local_70;
    uVar40 = local_78;
    uVar51 = local_74;
    if (uVar45 != 0xfffffffffffffff0) {
      uVar40 = unaff_EBP + local_158 +
               ((uint)(unaff_R15 >> 3) & 0x1fffffff ^
               (uVar46 << 0xe | uVar46 >> 0x12) ^ (uVar46 << 0x19 | uVar46 >> 7)) +
               (local_140 >> 10 ^
               (local_140 << 0xd | local_140 >> 0x13) ^ (local_140 << 0xf | local_140 >> 0x11));
      uVar51 = uVar46 + local_150 +
               (in_R8D >> 3 ^ (in_R8D << 0xe | in_R8D >> 0x12) ^ (in_R8D << 0x19 | in_R8D >> 7)) +
               (local_104 >> 10 ^
               (local_104 << 0xd | local_104 >> 0x13) ^ (local_104 << 0xf | local_104 >> 0x11));
      uVar43 = in_R8D + local_14c +
               (uVar36 >> 3 ^ (uVar36 << 0xe | uVar36 >> 0x12) ^ (uVar36 << 0x19 | uVar36 >> 7)) +
               (uVar40 >> 10 ^
               (uVar40 * 0x2000 | uVar40 >> 0x13) ^ (uVar40 * 0x8000 | uVar40 >> 0x11));
    }
    unaff_EBP = uVar40;
    in_R8D = uVar43;
    local_124 = local_6c;
    if (uVar45 != 0xfffffffffffffff0) {
      local_124 = uVar36 + local_148 +
                  (local_114 >> 3 ^
                  (local_114 << 0xe | local_114 >> 0x12) ^ (local_114 << 0x19 | local_114 >> 7)) +
                  (uVar51 >> 10 ^
                  (uVar51 << 0xd | uVar51 >> 0x13) ^ (uVar51 << 0xf | uVar51 >> 0x11));
    }
    local_128 = local_68;
    if (uVar45 != 0xfffffffffffffff0) {
      local_128 = local_114 + local_144 +
                  (local_110 >> 3 ^
                  (local_110 << 0xe | local_110 >> 0x12) ^ (local_110 << 0x19 | local_110 >> 7)) +
                  (in_R8D >> 10 ^
                  (in_R8D << 0xd | in_R8D >> 0x13) ^ (in_R8D << 0xf | in_R8D >> 0x11));
    }
    local_12c = local_64;
    if (uVar45 != 0xfffffffffffffff0) {
      local_12c = local_110 + local_140 +
                  (local_10c >> 3 ^
                  (local_10c << 0xe | local_10c >> 0x12) ^ (local_10c << 0x19 | local_10c >> 7)) +
                  (local_124 >> 10 ^
                  (local_124 << 0xd | local_124 >> 0x13) ^ (local_124 << 0xf | local_124 >> 0x11));
    }
    local_130 = local_60;
    if (uVar45 != 0xfffffffffffffff0) {
      local_130 = local_10c + local_104 +
                  (local_108 >> 3 ^
                  (local_108 << 0xe | local_108 >> 0x12) ^ (local_108 << 0x19 | local_108 >> 7)) +
                  (local_128 >> 10 ^
                  (local_128 << 0xd | local_128 >> 0x13) ^ (local_128 << 0xf | local_128 >> 0x11));
    }
    local_134 = local_5c;
    if (uVar45 != 0xfffffffffffffff0) {
      local_134 = local_108 + unaff_EBP +
                  (local_13c >> 3 ^
                  (local_13c << 0xe | local_13c >> 0x12) ^ (local_13c << 0x19 | local_13c >> 7)) +
                  (local_12c >> 10 ^
                  (local_12c << 0xd | local_12c >> 0x13) ^ (local_12c << 0xf | local_12c >> 0x11));
    }
    local_138 = local_58;
    if (uVar45 != 0xfffffffffffffff0) {
      local_138 = local_13c + uVar51 +
                  (local_158 >> 3 ^
                  (local_158 << 0xe | local_158 >> 0x12) ^ (local_158 << 0x19 | local_158 >> 7)) +
                  (local_130 >> 10 ^
                  (local_130 << 0xd | local_130 >> 0x13) ^ (local_130 << 0xf | local_130 >> 0x11));
    }
    local_f0 = local_54;
    if (uVar45 != 0xfffffffffffffff0) {
      local_f0 = local_158 + in_R8D +
                 (local_150 >> 3 ^
                 (local_150 << 0xe | local_150 >> 0x12) ^ (local_150 << 0x19 | local_150 >> 7)) +
                 (local_134 >> 10 ^
                 (local_134 << 0xd | local_134 >> 0x13) ^ (local_134 << 0xf | local_134 >> 0x11));
    }
    local_f4 = local_50;
    if (uVar45 != 0xfffffffffffffff0) {
      local_f4 = local_150 + local_124 +
                 (local_14c >> 3 ^
                 (local_14c << 0xe | local_14c >> 0x12) ^ (local_14c << 0x19 | local_14c >> 7)) +
                 (local_138 >> 10 ^
                 (local_138 << 0xd | local_138 >> 0x13) ^ (local_138 << 0xf | local_138 >> 0x11));
    }
    local_f8 = local_4c;
    if (uVar45 != 0xfffffffffffffff0) {
      local_f8 = local_14c + local_128 +
                 (local_148 >> 3 ^
                 (local_148 << 0xe | local_148 >> 0x12) ^ (local_148 << 0x19 | local_148 >> 7)) +
                 (local_f0 >> 10 ^
                 (local_f0 << 0xd | local_f0 >> 0x13) ^ (local_f0 << 0xf | local_f0 >> 0x11));
    }
    local_fc = local_48;
    if (uVar45 != 0xfffffffffffffff0) {
      local_fc = local_148 + local_12c +
                 (local_144 >> 3 ^
                 (local_144 << 0xe | local_144 >> 0x12) ^ (local_144 << 0x19 | local_144 >> 7)) +
                 (local_f4 >> 10 ^
                 (local_f4 << 0xd | local_f4 >> 0x13) ^ (local_f4 << 0xf | local_f4 >> 0x11));
    }
    local_100 = local_44;
    if (uVar45 != 0xfffffffffffffff0) {
      local_100 = local_144 + local_130 +
                  (local_140 >> 3 ^
                  (local_140 << 0xe | local_140 >> 0x12) ^ (local_140 << 0x19 | local_140 >> 7)) +
                  (local_f8 >> 10 ^
                  (local_f8 << 0xd | local_f8 >> 0x13) ^ (local_f8 << 0xf | local_f8 >> 0x11));
    }
    uVar43 = local_40;
    if (uVar45 != 0xfffffffffffffff0) {
      uVar43 = local_140 + local_134 +
               (local_104 >> 3 ^
               (local_104 << 0xe | local_104 >> 0x12) ^ (local_104 << 0x19 | local_104 >> 7)) +
               (local_fc >> 10 ^
               (local_fc << 0xd | local_fc >> 0x13) ^ (local_fc << 0xf | local_fc >> 0x11));
    }
    uVar40 = local_3c;
    if (uVar45 != 0xfffffffffffffff0) {
      uVar40 = local_104 + local_138 +
               (unaff_EBP >> 3 ^
               (unaff_EBP << 0xe | unaff_EBP >> 0x12) ^ (unaff_EBP << 0x19 | unaff_EBP >> 7)) +
               (local_100 >> 10 ^
               (local_100 << 0xd | local_100 >> 0x13) ^ (local_100 << 0xf | local_100 >> 0x11));
    }
    iVar39 = ((uVar48 ^ uVar50) & uVar47 ^ uVar48) +
             ((uVar47 << 7 | uVar47 >> 0x19) ^
             (uVar47 << 0x15 | uVar47 >> 0xb) ^ (uVar47 << 0x1a | uVar47 >> 6)) + uVar44 +
             SHA256_K[uVar45 + 0x10] + unaff_EBP;
    uVar38 = uVar38 + iVar39;
    uVar44 = ((uVar42 | uVar41) & uVar35 | uVar42 & uVar41) +
             ((uVar41 << 10 | uVar41 >> 0x16) ^
             (uVar41 << 0x13 | uVar41 >> 0xd) ^ (uVar41 << 0x1e | uVar41 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x11] + uVar48 + ((uVar50 ^ uVar47) & uVar38 ^ uVar50) + uVar51 +
             ((uVar38 * 0x80 | uVar38 >> 0x19) ^
             (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6));
    uVar35 = uVar35 + iVar39;
    uVar52 = ((uVar44 | uVar41) & uVar42 | uVar44 & uVar41) +
             ((uVar44 * 0x400 | uVar44 >> 0x16) ^
             (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x12] + uVar50 + ((uVar38 ^ uVar47) & uVar35 ^ uVar47) + in_R8D +
             ((uVar35 * 0x80 | uVar35 >> 0x19) ^
             (uVar35 * 0x200000 | uVar35 >> 0xb) ^ (uVar35 * 0x4000000 | uVar35 >> 6));
    uVar42 = uVar42 + iVar39;
    uVar49 = ((uVar52 | uVar44) & uVar41 | uVar52 & uVar44) +
             ((uVar52 * 0x400 | uVar52 >> 0x16) ^
             (uVar52 * 0x80000 | uVar52 >> 0xd) ^ (uVar52 * 0x40000000 | uVar52 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x13] + uVar47 + ((uVar35 ^ uVar38) & uVar42 ^ uVar38) + local_124 +
             ((uVar42 * 0x80 | uVar42 >> 0x19) ^
             (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6));
    uVar41 = uVar41 + iVar39;
    uVar46 = ((uVar49 | uVar52) & uVar44 | uVar49 & uVar52) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x14] + uVar38 + ((uVar42 ^ uVar35) & uVar41 ^ uVar35) + local_128 +
             ((uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6));
    uVar44 = uVar44 + iVar39;
    uVar38 = ((uVar46 | uVar49) & uVar52 | uVar46 & uVar49) +
             ((uVar46 * 0x400 | uVar46 >> 0x16) ^
             (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x15] + uVar35 + ((uVar41 ^ uVar42) & uVar44 ^ uVar42) + local_12c +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
    uVar52 = uVar52 + iVar39;
    uVar36 = ((uVar38 | uVar46) & uVar49 | uVar38 & uVar46) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x16] + uVar42 + ((uVar44 ^ uVar41) & uVar52 ^ uVar41) + local_130 +
             ((uVar52 * 0x80 | uVar52 >> 0x19) ^
             (uVar52 * 0x200000 | uVar52 >> 0xb) ^ (uVar52 * 0x4000000 | uVar52 >> 6));
    uVar49 = uVar49 + iVar39;
    uVar42 = ((uVar36 | uVar38) & uVar46 | uVar36 & uVar38) +
             ((uVar36 * 0x400 | uVar36 >> 0x16) ^
             (uVar36 * 0x80000 | uVar36 >> 0xd) ^ (uVar36 * 0x40000000 | uVar36 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x17] + uVar41 + ((uVar52 ^ uVar44) & uVar49 ^ uVar44) + local_134 +
             ((uVar49 * 0x80 | uVar49 >> 0x19) ^
             (uVar49 * 0x200000 | uVar49 >> 0xb) ^ (uVar49 * 0x4000000 | uVar49 >> 6));
    uVar46 = uVar46 + iVar39;
    uVar41 = ((uVar42 | uVar36) & uVar38 | uVar42 & uVar36) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x18] + uVar44 + ((uVar49 ^ uVar52) & uVar46 ^ uVar52) + local_138 +
             ((uVar46 * 0x80 | uVar46 >> 0x19) ^
             (uVar46 * 0x200000 | uVar46 >> 0xb) ^ (uVar46 * 0x4000000 | uVar46 >> 6));
    uVar38 = uVar38 + iVar39;
    uVar44 = ((uVar41 | uVar42) & uVar36 | uVar41 & uVar42) +
             ((uVar41 * 0x400 | uVar41 >> 0x16) ^
             (uVar41 * 0x80000 | uVar41 >> 0xd) ^ (uVar41 * 0x40000000 | uVar41 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x19] + uVar52 + ((uVar46 ^ uVar49) & uVar38 ^ uVar49) + local_f0 +
             ((uVar38 * 0x80 | uVar38 >> 0x19) ^
             (uVar38 * 0x200000 | uVar38 >> 0xb) ^ (uVar38 * 0x4000000 | uVar38 >> 6));
    uVar36 = uVar36 + iVar39;
    uVar35 = ((uVar44 | uVar41) & uVar42 | uVar44 & uVar41) +
             ((uVar44 * 0x400 | uVar44 >> 0x16) ^
             (uVar44 * 0x80000 | uVar44 >> 0xd) ^ (uVar44 * 0x40000000 | uVar44 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x1a] + uVar49 + ((uVar38 ^ uVar46) & uVar36 ^ uVar46) + local_f4 +
             ((uVar36 * 0x80 | uVar36 >> 0x19) ^
             (uVar36 * 0x200000 | uVar36 >> 0xb) ^ (uVar36 * 0x4000000 | uVar36 >> 6));
    uVar42 = uVar42 + iVar39;
    uVar49 = ((uVar35 | uVar44) & uVar41 | uVar35 & uVar44) +
             ((uVar35 * 0x400 | uVar35 >> 0x16) ^
             (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x1b] + uVar46 + ((uVar36 ^ uVar38) & uVar42 ^ uVar38) + local_f8 +
             ((uVar42 * 0x80 | uVar42 >> 0x19) ^
             (uVar42 * 0x200000 | uVar42 >> 0xb) ^ (uVar42 * 0x4000000 | uVar42 >> 6));
    uVar41 = uVar41 + iVar39;
    uVar46 = ((uVar49 | uVar35) & uVar44 | uVar49 & uVar35) +
             ((uVar49 * 0x400 | uVar49 >> 0x16) ^
             (uVar49 * 0x80000 | uVar49 >> 0xd) ^ (uVar49 * 0x40000000 | uVar49 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x1c] + uVar38 + ((uVar42 ^ uVar36) & uVar41 ^ uVar36) + local_fc +
             ((uVar41 * 0x80 | uVar41 >> 0x19) ^
             (uVar41 * 0x200000 | uVar41 >> 0xb) ^ (uVar41 * 0x4000000 | uVar41 >> 6));
    uVar44 = uVar44 + iVar39;
    uVar38 = ((uVar46 | uVar49) & uVar35 | uVar46 & uVar49) +
             ((uVar46 * 0x400 | uVar46 >> 0x16) ^
             (uVar46 * 0x80000 | uVar46 >> 0xd) ^ (uVar46 * 0x40000000 | uVar46 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x1d] + uVar36 + ((uVar41 ^ uVar42) & uVar44 ^ uVar42) + local_100 +
             ((uVar44 * 0x80 | uVar44 >> 0x19) ^
             (uVar44 * 0x200000 | uVar44 >> 0xb) ^ (uVar44 * 0x4000000 | uVar44 >> 6));
    uVar48 = uVar35 + iVar39;
    uVar35 = ((uVar38 | uVar46) & uVar49 | uVar38 & uVar46) +
             ((uVar38 * 0x400 | uVar38 >> 0x16) ^
             (uVar38 * 0x80000 | uVar38 >> 0xd) ^ (uVar38 * 0x40000000 | uVar38 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x1e] + uVar42 + ((uVar44 ^ uVar41) & uVar48 ^ uVar41) + uVar43 +
             ((uVar48 * 0x80 | uVar48 >> 0x19) ^
             (uVar48 * 0x200000 | uVar48 >> 0xb) ^ (uVar48 * 0x4000000 | uVar48 >> 6));
    uVar50 = uVar49 + iVar39;
    uVar42 = ((uVar35 | uVar38) & uVar46 | uVar35 & uVar38) +
             ((uVar35 * 0x400 | uVar35 >> 0x16) ^
             (uVar35 * 0x80000 | uVar35 >> 0xd) ^ (uVar35 * 0x40000000 | uVar35 >> 2)) + iVar39;
    iVar39 = SHA256_K[uVar45 + 0x1f] + uVar41 + ((uVar48 ^ uVar44) & uVar50 ^ uVar44) + uVar40 +
             ((uVar50 * 0x80 | uVar50 >> 0x19) ^
             (uVar50 * 0x200000 | uVar50 >> 0xb) ^ (uVar50 * 0x4000000 | uVar50 >> 6));
    uVar47 = uVar46 + iVar39;
    uVar41 = ((uVar42 | uVar35) & uVar38 | uVar42 & uVar35) +
             ((uVar42 * 0x400 | uVar42 >> 0x16) ^
             (uVar42 * 0x80000 | uVar42 >> 0xd) ^ (uVar42 * 0x40000000 | uVar42 >> 2)) + iVar39;
    uVar45 = uVar45 + 0x10;
    unaff_R15 = (ulong)uVar51;
    local_114 = local_128;
    local_110 = local_12c;
    local_10c = local_130;
    local_108 = local_134;
    local_13c = local_138;
    local_158 = local_f0;
    local_150 = local_f4;
    local_14c = local_f8;
    local_148 = local_fc;
    local_144 = local_100;
    uVar36 = local_124;
    local_140 = uVar43;
    local_104 = uVar40;
  } while (uVar45 < 0x30);
  (check->state).crc32 = uVar41 + (check->state).crc32;
  (check->state).sha256.state[1] = uVar42 + uVar2;
  (check->state).sha256.state[2] = uVar35 + uVar3;
  (check->state).sha256.state[3] = uVar38 + uVar4;
  (check->state).sha256.state[4] = uVar47 + uVar5;
  (check->state).sha256.state[5] = uVar50 + uVar6;
  (check->state).sha256.state[6] = uVar48 + uVar7;
  (check->state).sha256.state[7] = uVar44 + uVar8;
  return;
}

Assistant:

static void
process(lzma_check_state *check)
{
#ifdef WORDS_BIGENDIAN
	transform(check->state.sha256.state, check->buffer.u32);

#else
	uint32_t data[16];
	size_t i;

	for (i = 0; i < 16; ++i)
		data[i] = bswap32(check->buffer.u32[i]);

	transform(check->state.sha256.state, data);
#endif

	return;
}